

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::GBufferFilm::AddSplat
          (GBufferFilm *this,Point2f *p,SampledSpectrum v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  initializer_list<float> __l;
  bool bVar2;
  Point2i p_00;
  Pixel *pPVar3;
  long in_RDI;
  float fVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  RGB RVar20;
  SampledSpectrum SVar21;
  int i;
  Pixel *pixel;
  Float wt;
  Point2i pi;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  Bounds2i splatBounds;
  Point2f pDiscrete;
  Float m;
  RGB rgb;
  SampledSpectrum H;
  float in_stack_fffffffffffffe38;
  Float in_stack_fffffffffffffe3c;
  Bounds2i *in_stack_fffffffffffffe40;
  Bounds2iIterator *in_stack_fffffffffffffe48;
  Bounds2iIterator *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe80 [16];
  int in_stack_fffffffffffffe94;
  int c;
  char *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  LogLevel level;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Bounds2iIterator local_118;
  Tuple2<pbrt::Point2,_int> *local_108;
  Bounds2<int> local_fc;
  undefined8 local_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  Tuple2<pbrt::Point2,_int> local_c4;
  undefined8 local_bc;
  undefined8 local_b4;
  undefined8 local_ac;
  Tuple2<pbrt::Point2,_int> local_9c;
  Tuple2<pbrt::Point2,_int> local_94;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar22;
  undefined4 uVar23;
  Float FVar24;
  RGB local_44;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar17 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 auVar19 [56];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  auVar19 = in_ZMM1._8_56_;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_8 = vmovlpd_avx(in_ZMM1._0_16_);
  bVar2 = SampledSpectrum::HasNaNs((SampledSpectrum *)in_stack_fffffffffffffe48);
  if (bVar2) {
    LogFatal<char_const(&)[13]>
              (level,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
               in_stack_fffffffffffffe80._8_8_,in_stack_fffffffffffffe80._0_8_);
  }
  PixelSensor::ImagingRatio(*(PixelSensor **)(in_RDI + 0x28));
  auVar17 = extraout_var;
  SVar21 = SampledSpectrum::operator*
                     ((SampledSpectrum *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  auVar18._0_8_ = SVar21.values.values._8_8_;
  auVar18._8_56_ = auVar19;
  auVar6._0_8_ = SVar21.values.values._0_8_;
  auVar6._8_56_ = auVar17;
  local_38 = vmovlpd_avx(auVar6._0_16_);
  local_30 = vmovlpd_avx(auVar18._0_16_);
  RVar20 = PixelSensor::ToSensorRGB
                     ((PixelSensor *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      (SampledWavelengths *)
                      CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  local_44.b = RVar20.b;
  auVar7._0_8_ = RVar20._0_8_;
  auVar7._8_56_ = auVar17;
  local_44._0_8_ = vmovlpd_avx(auVar7._0_16_);
  __l._M_array._4_4_ = in_stack_fffffffffffffe3c;
  __l._M_array._0_4_ = in_stack_fffffffffffffe38;
  __l._M_len = (size_type)in_stack_fffffffffffffe40;
  FVar24 = local_44.r;
  fVar4 = std::max<float>(__l);
  if (*(float *)(in_RDI + 0x78) < fVar4) {
    RGB::operator*=(&local_44,*(float *)(in_RDI + 0x78) / fVar4);
  }
  Vector2<float>::Vector2
            ((Vector2<float> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
             in_stack_fffffffffffffe38);
  auVar8._0_8_ = Point2<float>::operator+
                           ((Point2<float> *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (Vector2<float> *)0x6b12df);
  auVar8._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar22 = (undefined4)uVar1;
  uVar23 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar9._0_8_ = FilterHandle::Radius
                           ((FilterHandle *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar9._8_56_ = extraout_var_01;
  local_bc = vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ =
       Point2<float>::operator-
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  (Vector2<float> *)0x6b131e);
  auVar10._8_56_ = extraout_var_02;
  local_b4 = vmovlpd_avx(auVar10._0_16_);
  auVar11._0_8_ =
       Floor<pbrt::Point2,float>
                 ((Tuple2<pbrt::Point2,_float> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar11._8_56_ = extraout_var_03;
  local_ac = vmovlpd_avx(auVar11._0_16_);
  Point2<int>::Point2<float>
            (&in_stack_fffffffffffffe40->pMin,
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar12._0_8_ =
       FilterHandle::Radius
                 ((FilterHandle *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar12._8_56_ = extraout_var_04;
  local_e4 = vmovlpd_avx(auVar12._0_16_);
  auVar13._0_8_ =
       Point2<float>::operator+
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  (Vector2<float> *)0x6b1377);
  auVar13._8_56_ = extraout_var_05;
  local_dc = vmovlpd_avx(auVar13._0_16_);
  auVar14._0_8_ =
       Floor<pbrt::Point2,float>
                 ((Tuple2<pbrt::Point2,_float> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar14._8_56_ = extraout_var_06;
  local_d4 = vmovlpd_avx(auVar14._0_16_);
  Point2<int>::Point2<float>
            (&in_stack_fffffffffffffe40->pMin,
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Vector2<int>::Vector2
            ((Vector2<int> *)in_stack_fffffffffffffe40,(int)in_stack_fffffffffffffe3c,
             (int)in_stack_fffffffffffffe38);
  local_c4 = (Tuple2<pbrt::Point2,_int>)
             Point2<int>::operator+
                       ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                        ,(Vector2<int> *)0x6b13d4);
  Bounds2<int>::Bounds2
            ((Bounds2<int> *)in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->p,
             &in_stack_fffffffffffffe40->pMin);
  local_fc = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffe50,
                            (Bounds2<int> *)in_stack_fffffffffffffe48);
  local_9c = local_fc.pMin.super_Tuple2<pbrt::Point2,_int>;
  local_94 = local_fc.pMax.super_Tuple2<pbrt::Point2,_int>;
  local_108 = &local_9c;
  local_118 = pbrt::begin((Bounds2i *)0x6b145c);
  pbrt::end(in_stack_fffffffffffffe40);
  while (bVar2 = Bounds2iIterator::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48),
        bVar2) {
    p_00 = Bounds2iIterator::operator*(&local_118);
    in_stack_fffffffffffffe50 = (Bounds2iIterator *)(in_RDI + 0x18);
    auVar15._0_8_ =
         Point2<float>::operator-
                   ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    (Point2<int> *)0x6b14e2);
    auVar15._8_56_ = extraout_var_07;
    vmovlpd_avx(auVar15._0_16_);
    in_stack_fffffffffffffe48 = (Bounds2iIterator *)&stack0xfffffffffffffeac;
    Vector2<float>::Vector2
              ((Vector2<float> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
               in_stack_fffffffffffffe38);
    auVar16._0_8_ =
         Tuple2<pbrt::Vector2,float>::operator-
                   ((Tuple2<pbrt::Vector2,_float> *)
                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    (Vector2<float> *)0x6b1512);
    auVar16._8_56_ = extraout_var_08;
    vmovlpd_avx(auVar16._0_16_);
    Point2<float>::Point2<float>
              ((Point2<float> *)in_stack_fffffffffffffe40,
               (Vector2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    FVar5 = FilterHandle::Evaluate
                      ((FilterHandle *)in_stack_fffffffffffffe50,
                       (Point2f *)in_stack_fffffffffffffe48);
    if ((FVar5 != 0.0) || (NAN(FVar5))) {
      pPVar3 = Array2D<pbrt::GBufferFilm::Pixel>::operator[]
                         ((Array2D<pbrt::GBufferFilm::Pixel> *)(in_RDI + 0x50),p_00);
      for (c = 0; c < 3; c = c + 1) {
        in_stack_fffffffffffffe40 = (Bounds2i *)(pPVar3->splatRGB + c);
        in_stack_fffffffffffffe3c = FVar5;
        RGB::operator[](&local_44,c);
        AtomicDouble::Add((AtomicDouble *)CONCAT44(FVar24,uVar23),
                          (double)CONCAT44(uVar22,in_stack_ffffffffffffff78));
      }
    }
    Bounds2iIterator::operator++
              ((Bounds2iIterator *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  return;
}

Assistant:

void GBufferFilm::AddSplat(const Point2f &p, SampledSpectrum v,
                           const SampledWavelengths &lambda) {
    // NOTE: same code as RGBFilm::AddSplat()...
    CHECK(!v.HasNaNs());
    // First convert to sensor exposure, H, then to camera RGB
    SampledSpectrum H = v * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - filter.Radius())),
                         Point2i(Floor(pDiscrete + filter.Radius())) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);
    for (Point2i pi : splatBounds) {
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}